

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O0

void fe_mul121666(i32 *h,i32 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  i64 iVar12;
  long lVar13;
  i64 iVar14;
  long lVar15;
  i64 iVar16;
  long lVar17;
  i64 iVar18;
  long lVar19;
  i64 iVar20;
  i64 iVar21;
  long v;
  i64 iVar22;
  long v_00;
  i64 iVar23;
  long v_01;
  i64 iVar24;
  long v_02;
  i64 iVar25;
  i64 carry9;
  i64 carry8;
  i64 carry7;
  i64 carry6;
  i64 carry5;
  i64 carry4;
  i64 carry3;
  i64 carry2;
  i64 carry1;
  i64 carry0;
  i64 h9;
  i64 h8;
  i64 h7;
  i64 h6;
  i64 h5;
  i64 h4;
  i64 h3;
  i64 h2;
  i64 h1;
  i64 h0;
  i32 f9;
  i32 f8;
  i32 f7;
  i32 f6;
  i32 f5;
  i32 f4;
  i32 f3;
  i32 f2;
  i32 f1;
  i32 f0;
  i32 *f_local;
  i32 *h_local;
  
  iVar1 = f[1];
  iVar2 = f[2];
  iVar3 = f[3];
  iVar4 = f[4];
  iVar5 = f[5];
  iVar6 = f[6];
  iVar7 = f[7];
  iVar8 = f[8];
  iVar9 = f[9];
  lVar10 = (long)iVar9 * 0x1db42 + 0x1000000 >> 0x19;
  lVar11 = lVar10 * 0x13 + (long)*f * 0x1db42;
  iVar12 = shift_left(lVar10,0x19);
  lVar10 = (long)iVar1 * 0x1db42 + 0x1000000 >> 0x19;
  lVar13 = lVar10 + (long)iVar2 * 0x1db42;
  iVar14 = shift_left(lVar10,0x19);
  lVar10 = (long)iVar3 * 0x1db42 + 0x1000000 >> 0x19;
  lVar15 = lVar10 + (long)iVar4 * 0x1db42;
  iVar16 = shift_left(lVar10,0x19);
  lVar10 = (long)iVar5 * 0x1db42 + 0x1000000 >> 0x19;
  lVar17 = lVar10 + (long)iVar6 * 0x1db42;
  iVar18 = shift_left(lVar10,0x19);
  lVar10 = (long)iVar7 * 0x1db42 + 0x1000000 >> 0x19;
  lVar19 = lVar10 + (long)iVar8 * 0x1db42;
  iVar20 = shift_left(lVar10,0x19);
  lVar10 = lVar11 + 0x2000000 >> 0x1a;
  iVar21 = shift_left(lVar10,0x1a);
  v = lVar13 + 0x2000000 >> 0x1a;
  iVar22 = shift_left(v,0x1a);
  v_00 = lVar15 + 0x2000000 >> 0x1a;
  iVar23 = shift_left(v_00,0x1a);
  v_01 = lVar17 + 0x2000000 >> 0x1a;
  iVar24 = shift_left(v_01,0x1a);
  v_02 = lVar19 + 0x2000000 >> 0x1a;
  iVar25 = shift_left(v_02,0x1a);
  *h = (int)lVar11 - (int)iVar21;
  h[1] = (int)lVar10 + ((int)((long)iVar1 * 0x1db42) - (int)iVar14);
  h[2] = (int)lVar13 - (int)iVar22;
  h[3] = (int)v + ((int)((long)iVar3 * 0x1db42) - (int)iVar16);
  h[4] = (int)lVar15 - (int)iVar23;
  h[5] = (int)v_00 + ((int)((long)iVar5 * 0x1db42) - (int)iVar18);
  h[6] = (int)lVar17 - (int)iVar24;
  h[7] = (int)v_01 + ((int)((long)iVar7 * 0x1db42) - (int)iVar20);
  h[8] = (int)lVar19 - (int)iVar25;
  h[9] = (int)v_02 + ((int)((long)iVar9 * 0x1db42) - (int)iVar12);
  return;
}

Assistant:

void fe_mul121666(fe h, fe f) {
    i32 f0 = f[0];
    i32 f1 = f[1];
    i32 f2 = f[2];
    i32 f3 = f[3];
    i32 f4 = f[4];
    i32 f5 = f[5];
    i32 f6 = f[6];
    i32 f7 = f[7];
    i32 f8 = f[8];
    i32 f9 = f[9];
    i64 h0 = f0 * (i64) 121666;
    i64 h1 = f1 * (i64) 121666;
    i64 h2 = f2 * (i64) 121666;
    i64 h3 = f3 * (i64) 121666;
    i64 h4 = f4 * (i64) 121666;
    i64 h5 = f5 * (i64) 121666;
    i64 h6 = f6 * (i64) 121666;
    i64 h7 = f7 * (i64) 121666;
    i64 h8 = f8 * (i64) 121666;
    i64 h9 = f9 * (i64) 121666;
    i64 carry0;
    i64 carry1;
    i64 carry2;
    i64 carry3;
    i64 carry4;
    i64 carry5;
    i64 carry6;
    i64 carry7;
    i64 carry8;
    i64 carry9;

    carry9 = (h9 + (i64) (1<<24)) >> 25; h0 += carry9 * 19; h9 -= shift_left(carry9, 25);
    carry1 = (h1 + (i64) (1<<24)) >> 25; h2 += carry1; h1 -= shift_left(carry1, 25);
    carry3 = (h3 + (i64) (1<<24)) >> 25; h4 += carry3; h3 -= shift_left(carry3, 25);
    carry5 = (h5 + (i64) (1<<24)) >> 25; h6 += carry5; h5 -= shift_left(carry5, 25);
    carry7 = (h7 + (i64) (1<<24)) >> 25; h8 += carry7; h7 -= shift_left(carry7, 25);

    carry0 = (h0 + (i64) (1<<25)) >> 26; h1 += carry0; h0 -= shift_left(carry0, 26);
    carry2 = (h2 + (i64) (1<<25)) >> 26; h3 += carry2; h2 -= shift_left(carry2, 26);
    carry4 = (h4 + (i64) (1<<25)) >> 26; h5 += carry4; h4 -= shift_left(carry4, 26);
    carry6 = (h6 + (i64) (1<<25)) >> 26; h7 += carry6; h6 -= shift_left(carry6, 26);
    carry8 = (h8 + (i64) (1<<25)) >> 26; h9 += carry8; h8 -= shift_left(carry8, 26);

    h[0] = h0;
    h[1] = h1;
    h[2] = h2;
    h[3] = h3;
    h[4] = h4;
    h[5] = h5;
    h[6] = h6;
    h[7] = h7;
    h[8] = h8;
    h[9] = h9;
}